

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * re2::Regexp::StarPlusOrQuest(RegexpOp op,Regexp *sub,ParseFlags flags)

{
  byte bVar1;
  Regexp *this;
  Regexp *pRVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  
  bVar1 = sub->op_;
  if ((bVar1 != op) || (pRVar2 = sub, sub->parse_flags_ != flags)) {
    if (bVar1 == kRegexpStar) {
      if (sub->parse_flags_ == flags) {
        return sub;
      }
    }
    else if (((bVar1 & 0xfe) == 8) && (sub->parse_flags_ == flags)) {
      pRVar2 = (Regexp *)operator_new(0x28);
      pRVar2->op_ = '\a';
      pRVar2->simple_ = '\0';
      pRVar2->parse_flags_ = (uint16_t)flags;
      pRVar2->ref_ = 1;
      pRVar2->nsub_ = 1;
      (pRVar2->field_7).field_1.name_ = (string *)0x0;
      pRVar2->down_ = (Regexp *)0x0;
      (pRVar2->field_7).field_3.cc_ = (CharClass *)0x0;
      if (sub->nsub_ < 2) {
        paVar3 = &sub->field_5;
      }
      else {
        paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(sub->field_5).submany_;
      }
      this = paVar3->subone_;
      Incref(this);
      (pRVar2->field_5).subone_ = this;
      Decref(sub);
      return pRVar2;
    }
    pRVar2 = (Regexp *)operator_new(0x28);
    pRVar2->op_ = (uint8_t)op;
    pRVar2->simple_ = '\0';
    pRVar2->parse_flags_ = (uint16_t)flags;
    pRVar2->ref_ = 1;
    pRVar2->nsub_ = 1;
    (pRVar2->field_7).field_1.name_ = (string *)0x0;
    pRVar2->down_ = (Regexp *)0x0;
    (pRVar2->field_7).field_3.cc_ = (CharClass *)0x0;
    (pRVar2->field_5).subone_ = sub;
  }
  return pRVar2;
}

Assistant:

Regexp* Regexp::StarPlusOrQuest(RegexpOp op, Regexp* sub, ParseFlags flags) {
  // Squash **, ++ and ??.
  if (op == sub->op() && flags == sub->parse_flags())
    return sub;

  // Squash *+, *?, +*, +?, ?* and ?+. They all squash to *, so because
  // op is Star/Plus/Quest, we just have to check that sub->op() is too.
  if ((sub->op() == kRegexpStar ||
       sub->op() == kRegexpPlus ||
       sub->op() == kRegexpQuest) &&
      flags == sub->parse_flags()) {
    // If sub is Star, no need to rewrite it.
    if (sub->op() == kRegexpStar)
      return sub;

    // Rewrite sub to Star.
    Regexp* re = new Regexp(kRegexpStar, flags);
    re->AllocSub(1);
    re->sub()[0] = sub->sub()[0]->Incref();
    sub->Decref();  // We didn't consume the reference after all.
    return re;
  }

  Regexp* re = new Regexp(op, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}